

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BBlock.h
# Opt level: O0

void __thiscall
dg::BBlock<dg::LLVMNode>::BBlock(BBlock<dg::LLVMNode> *this,LLVMNode *head,DependenceGraphT *dg)

{
  DependenceGraphT *in_RDX;
  long in_RSI;
  BBlock<dg::LLVMNode> *in_RDI;
  LLVMNode *in_stack_ffffffffffffffd8;
  
  in_RDI->key = (KeyT)0x0;
  in_RDI->dg = in_RDX;
  std::__cxx11::list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_>::list
            ((list<dg::LLVMNode_*,_std::allocator<dg::LLVMNode_*>_> *)0x17bb96);
  DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U>::DGContainer
            ((DGContainer<dg::BBlock<dg::LLVMNode>::BBlockEdge,_8U> *)0x17bba4);
  EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U>::EdgesContainer
            ((EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U> *)0x17bbb2);
  EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U>::EdgesContainer
            ((EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U> *)0x17bbc3);
  EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U>::EdgesContainer
            ((EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U> *)0x17bbd4);
  EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U>::EdgesContainer
            ((EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U> *)0x17bbe5);
  in_RDI->ipostdom = (BBlock<dg::LLVMNode> *)0x0;
  EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U>::EdgesContainer
            ((EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U> *)0x17bc01);
  in_RDI->idom = (BBlock<dg::LLVMNode> *)0x0;
  EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U>::EdgesContainer
            ((EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U> *)0x17bc1d);
  EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U>::EdgesContainer
            ((EdgesContainer<dg::BBlock<dg::LLVMNode>,_4U> *)0x17bc2e);
  in_RDI->slice_id = 0;
  in_RDI->delete_nodes_on_destr = false;
  std::set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_>::set
            ((set<dg::LLVMNode_*,_std::less<dg::LLVMNode_*>,_std::allocator<dg::LLVMNode_*>_> *)
             0x17bc51);
  legacy::AnalysesAuxiliaryData::AnalysesAuxiliaryData(&in_RDI->analysisAuxData);
  if (in_RSI != 0) {
    append(in_RDI,in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

BBlock<NodeT>(NodeT *head = nullptr, DependenceGraphT *dg = nullptr)
            : key(KeyT()), dg(dg), ipostdom(nullptr) {
        if (head) {
            append(head);
            assert(!dg || head->getDG() == nullptr || dg == head->getDG());
        }
    }